

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O2

Result<vkb::Instance> * __thiscall
vkb::InstanceBuilder::build(Result<vkb::Instance> *__return_storage_ptr__,InstanceBuilder *this)

{
  uint uVar1;
  undefined4 uVar2;
  pointer ppcVar3;
  undefined4 uVar7;
  pointer pVVar4;
  pointer pVVar5;
  VkBaseOutStructure *pVVar6;
  undefined8 uVar8;
  undefined8 uVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  int iVar15;
  uint uVar16;
  VkResult VVar17;
  SystemInfo *pSVar18;
  pointer ppVVar19;
  pointer pVVar20;
  ulong uVar21;
  pointer pVVar22;
  char **ext;
  pointer ppcVar23;
  char **layer;
  error_code eVar24;
  uint32_t instance_version;
  vector<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_> pNext_chain;
  vector<const_char_*,_std::allocator<const_char_*>_> layers;
  vector<const_char_*,_std::allocator<const_char_*>_> extensions;
  Instance instance;
  VkInstanceCreateInfo instance_create_info;
  SystemInfo system;
  Result<vkb::SystemInfo> sys_info_ret;
  undefined1 local_254;
  uint local_250;
  uint local_24c;
  _Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_> local_248;
  _Vector_base<const_char_*,_std::allocator<const_char_*>_> local_228;
  _Vector_base<const_char_*,_std::allocator<const_char_*>_> local_208;
  VkInstance local_1e8;
  VkDebugUtilsMessengerEXT pVStack_1e0;
  VkAllocationCallbacks *local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 local_1c0;
  undefined1 local_1b8;
  undefined1 uStack_1b7;
  undefined6 uStack_1b6;
  VkInstanceCreateInfo local_1a8;
  VkApplicationInfo local_168;
  SystemInfo local_130;
  SystemInfo local_f8;
  pointer pVStack_c0;
  ulong local_b8;
  pointer pVStack_b0;
  SystemInfo local_a8;
  Result<vkb::SystemInfo> local_70;
  
  SystemInfo::get_system_info(&local_70,(this->info).fp_vkGetInstanceProcAddr);
  if (local_70.m_init == false) {
    eVar24 = Result<vkb::SystemInfo>::error(&local_70);
    (__return_storage_ptr__->field_0).m_error.type._M_value = eVar24._M_value;
    (__return_storage_ptr__->field_0).m_value.debug_messenger =
         (VkDebugUtilsMessengerEXT)eVar24._M_cat;
    (__return_storage_ptr__->field_0).m_error.vk_result = VK_SUCCESS;
    __return_storage_ptr__->m_init = false;
    goto LAB_00103ef1;
  }
  pSVar18 = Result<vkb::SystemInfo>::value(&local_70);
  SystemInfo::SystemInfo(&local_130,pSVar18);
  local_250 = 0x400000;
  uVar16 = (this->info).required_api_version;
  uVar1 = 0x400000;
  if (uVar16 < 0x400001 && (this->info).minimum_instance_version < 0x400001) {
LAB_00103bb1:
    local_24c = uVar1;
    local_168.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    local_168._4_4_ = 0;
    local_168.pNext = (void *)0x0;
    local_168.pApplicationName = (this->info).app_name;
    if (local_168.pApplicationName == (char *)0x0) {
      local_168.pApplicationName = "";
    }
    local_168._28_4_ = 0;
    local_168.applicationVersion = (this->info).application_version;
    local_168.pEngineName = (this->info).engine_name;
    if (local_168.pEngineName == (char *)0x0) {
      local_168.pEngineName = "";
    }
    local_168.engineVersion = (this->info).engine_version;
    local_208._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_228._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_208._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_208._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_228._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_228._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ppcVar3 = (this->info).extensions.
              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    local_168.apiVersion = local_24c;
    for (ppcVar23 = (this->info).extensions.
                    super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                    super__Vector_impl_data._M_start; ppcVar23 != ppcVar3; ppcVar23 = ppcVar23 + 1)
    {
      std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                ((vector<const_char_*,_std::allocator<const_char_*>_> *)&local_208,ppcVar23);
    }
    if ((((this->info).debug_callback != (PFN_vkDebugUtilsMessengerCallbackEXT)0x0) &&
        ((this->info).use_debug_messenger == true)) && (local_130.debug_utils_available == true)) {
      local_1a8._0_8_ = "VK_EXT_debug_utils";
      std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)&local_208,(char **)&local_1a8);
    }
    if ((local_24c < 0x401000) &&
       (bVar10 = detail::check_extension_supported
                           (&local_130.available_extensions,"VK_KHR_get_physical_device_properties2"
                           ), bVar10)) {
      local_1a8._0_8_ = "VK_KHR_get_physical_device_properties2";
      std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)&local_208,(char **)&local_1a8);
      local_254 = 1;
    }
    else {
      local_254 = 0;
    }
    bVar10 = detail::check_extension_supported
                       (&local_130.available_extensions,"VK_KHR_portability_enumeration");
    if (bVar10) {
      local_1a8._0_8_ = "VK_KHR_portability_enumeration";
      std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)&local_208,(char **)&local_1a8);
    }
    if ((this->info).headless_context == false) {
      local_1a8._0_8_ = &local_130;
      local_1a8.pNext = &local_208;
      bVar11 = build::anon_class_16_2_8af7eade::operator()
                         ((anon_class_16_2_8af7eade *)&local_1a8,"VK_KHR_surface");
      bVar12 = build::anon_class_16_2_8af7eade::operator()
                         ((anon_class_16_2_8af7eade *)&local_1a8,"VK_KHR_xcb_surface");
      bVar13 = build::anon_class_16_2_8af7eade::operator()
                         ((anon_class_16_2_8af7eade *)&local_1a8,"VK_KHR_xlib_surface");
      bVar14 = build::anon_class_16_2_8af7eade::operator()
                         ((anon_class_16_2_8af7eade *)&local_1a8,"VK_KHR_wayland_surface");
      if (bVar11 && ((bVar12 || bVar13) || bVar14)) goto LAB_00103d76;
      (__return_storage_ptr__->field_0).m_error.type._M_value = 10;
LAB_00103ebd:
      (__return_storage_ptr__->field_0).m_value.debug_messenger =
           (VkDebugUtilsMessengerEXT)&detail::instance_error_category;
      (__return_storage_ptr__->field_0).m_error.vk_result = VK_SUCCESS;
      __return_storage_ptr__->m_init = false;
    }
    else {
LAB_00103d76:
      bVar11 = detail::check_extensions_supported
                         (&local_130.available_extensions,
                          (vector<const_char_*,_std::allocator<const_char_*>_> *)&local_208);
      if (!bVar11) {
        (__return_storage_ptr__->field_0).m_error.type._M_value = 9;
        goto LAB_00103ebd;
      }
      ppcVar3 = (this->info).layers.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      for (ppcVar23 = (this->info).layers.
                      super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                      super__Vector_impl_data._M_start; ppcVar23 != ppcVar3; ppcVar23 = ppcVar23 + 1
          ) {
        std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                  ((vector<const_char_*,_std::allocator<const_char_*>_> *)&local_228,ppcVar23);
      }
      if (((this->info).enable_validation_layers != false) ||
         (((this->info).request_validation_layers == true &&
          (local_130.validation_layers_available == true)))) {
        std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                  ((vector<const_char_*,_std::allocator<const_char_*>_> *)&local_228,
                   &detail::validation_layer_name);
      }
      bVar11 = detail::check_layers_supported
                         (&local_130.available_layers,
                          (vector<const_char_*,_std::allocator<const_char_*>_> *)&local_228);
      if (!bVar11) {
        (__return_storage_ptr__->field_0).m_error.type._M_value = 8;
        goto LAB_00103ebd;
      }
      local_248._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_248._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_248._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_a8.available_extensions.
      super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_a8.available_extensions.
      super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_a8.available_layers.
      super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
      local_a8.available_layers.
      super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      local_a8.available_extensions.
      super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = 0;
      local_a8.available_extensions.
      super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl.
      super__Vector_impl_data._M_start._4_4_ = 0;
      local_a8.available_layers.
      super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_a8.available_layers.
      super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      if ((this->info).use_debug_messenger == true) {
        local_1a8._0_8_ = &local_a8;
        local_a8.available_layers.
        super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x3b9cbe04;
        uVar2 = (this->info).debug_message_severity;
        uVar7 = (this->info).debug_message_type;
        local_a8.available_extensions.
        super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)(this->info).debug_callback;
        local_a8.available_extensions.
        super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)(this->info).debug_user_data_pointer;
        local_a8.available_layers.
        super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ = uVar2;
        local_a8.available_extensions.
        super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = uVar7;
        std::vector<VkBaseOutStructure*,std::allocator<VkBaseOutStructure*>>::
        emplace_back<VkBaseOutStructure*>
                  ((vector<VkBaseOutStructure*,std::allocator<VkBaseOutStructure*>> *)&local_248,
                   (VkBaseOutStructure **)&local_1a8);
      }
      local_b8 = 0;
      pVStack_b0 = (pointer)0x0;
      local_f8.validation_layers_available = false;
      local_f8.debug_utils_available = false;
      local_f8._50_2_ = 0;
      local_f8.instance_api_version = 0;
      pVStack_c0 = (pointer)0x0;
      local_f8.available_extensions.
      super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_f8.available_extensions.
      super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pVVar4 = (this->info).enabled_validation_features.
               super__Vector_base<VkValidationFeatureEnableEXT,_std::allocator<VkValidationFeatureEnableEXT>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar21 = (long)(this->info).enabled_validation_features.
                     super__Vector_base<VkValidationFeatureEnableEXT,_std::allocator<VkValidationFeatureEnableEXT>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar4;
      if (uVar21 == 0) {
        pVVar20 = (this->info).disabled_validation_features.
                  super__Vector_base<VkValidationFeatureDisableEXT,_std::allocator<VkValidationFeatureDisableEXT>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pVVar22 = (this->info).disabled_validation_features.
                  super__Vector_base<VkValidationFeatureDisableEXT,_std::allocator<VkValidationFeatureDisableEXT>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (pVVar22 != pVVar20) goto LAB_00103f26;
      }
      else {
        pVVar20 = (this->info).disabled_validation_features.
                  super__Vector_base<VkValidationFeatureDisableEXT,_std::allocator<VkValidationFeatureDisableEXT>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pVVar22 = (this->info).disabled_validation_features.
                  super__Vector_base<VkValidationFeatureDisableEXT,_std::allocator<VkValidationFeatureDisableEXT>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
LAB_00103f26:
        local_1a8._0_8_ =
             &local_f8.available_extensions.
              super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>.
              _M_impl.super__Vector_impl_data._M_finish;
        local_f8.available_extensions.
        super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x3b9e8ed8;
        local_f8._48_8_ = uVar21 >> 2 & 0xffffffff;
        local_b8 = (ulong)((long)pVVar22 - (long)pVVar20) >> 2 & 0xffffffff;
        pVStack_c0 = pVVar4;
        pVStack_b0 = pVVar20;
        std::vector<VkBaseOutStructure*,std::allocator<VkBaseOutStructure*>>::
        emplace_back<VkBaseOutStructure*>
                  ((vector<VkBaseOutStructure*,std::allocator<VkBaseOutStructure*>> *)&local_248,
                   (VkBaseOutStructure **)&local_1a8);
      }
      local_f8.available_layers.
      super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_f8.available_extensions.
      super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_f8.available_layers.
      super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_f8.available_layers.
      super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      pVVar5 = (pointer)(this->info).disabled_validation_checks.
                        super__Vector_base<VkValidationCheckEXT,_std::allocator<VkValidationCheckEXT>_>
                        ._M_impl.super__Vector_impl_data._M_start;
      uVar21 = (long)(this->info).disabled_validation_checks.
                     super__Vector_base<VkValidationCheckEXT,_std::allocator<VkValidationCheckEXT>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar5;
      if (uVar21 != 0) {
        local_1a8._0_8_ = &local_f8;
        local_f8.available_layers.
        super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x3b9bb848;
        local_f8.available_layers.
        super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)(uVar21 >> 2 & 0xffffffff);
        local_f8.available_extensions.
        super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl.
        super__Vector_impl_data._M_start = pVVar5;
        std::vector<VkBaseOutStructure*,std::allocator<VkBaseOutStructure*>>::
        emplace_back<VkBaseOutStructure*>
                  ((vector<VkBaseOutStructure*,std::allocator<VkBaseOutStructure*>> *)&local_248,
                   (VkBaseOutStructure **)&local_1a8);
      }
      local_1a8.pNext = (_Vector_base<const_char_*,_std::allocator<const_char_*>_> *)0x0;
      local_1a8.enabledExtensionCount = 0;
      local_1a8._52_4_ = 0;
      local_1a8.ppEnabledExtensionNames = (char **)0x0;
      local_1a8.enabledLayerCount = 0;
      local_1a8._36_4_ = 0;
      local_1a8.ppEnabledLayerNames = (char **)0x0;
      local_1a8.flags = 0;
      local_1a8._20_4_ = 0;
      local_1a8.pApplicationInfo = (VkApplicationInfo *)0x0;
      local_1a8._0_8_ = (SystemInfo *)0x1;
      detail::setup_pNext_chain<VkInstanceCreateInfo>
                (&local_1a8,
                 (vector<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_> *)&local_248);
      ppVVar19 = local_248._M_impl.super__Vector_impl_data._M_start;
      while (ppVVar19 != local_248._M_impl.super__Vector_impl_data._M_finish) {
        pVVar6 = *ppVVar19;
        ppVVar19 = ppVVar19 + 1;
        if (pVVar6->sType == VK_STRUCTURE_TYPE_APPLICATION_INFO) {
          __assert_fail("node->sType != VK_STRUCTURE_TYPE_APPLICATION_INFO",
                        "/workspace/llm4binary/github/license_c_cmakelists/charles-lunarg[P]vk-bootstrap/src/VkBootstrap.cpp"
                        ,0x2ee,"Result<Instance> vkb::InstanceBuilder::build() const");
        }
      }
      uVar16 = (this->info).flags;
      local_1a8.pApplicationInfo = &local_168;
      local_1a8.enabledExtensionCount =
           (uint32_t)
           ((ulong)((long)local_208._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_208._M_impl.super__Vector_impl_data._M_start) >> 3);
      local_1a8.ppEnabledExtensionNames = local_208._M_impl.super__Vector_impl_data._M_start;
      local_1a8.enabledLayerCount =
           (uint32_t)
           ((ulong)((long)local_228._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_228._M_impl.super__Vector_impl_data._M_start) >> 3);
      local_1a8.ppEnabledLayerNames = local_228._M_impl.super__Vector_impl_data._M_start;
      if (bVar10) {
        uVar16 = uVar16 | 1;
      }
      local_1a8.flags = uVar16;
      local_1c8 = 0;
      local_1d8 = (VkAllocationCallbacks *)0x0;
      uStack_1d0 = 0;
      local_1e8 = (VkInstance)0x0;
      pVStack_1e0 = (VkDebugUtilsMessengerEXT)0x0;
      local_1c0 = 0x40000000400000;
      local_1b8 = 0;
      uStack_1b7 = 0;
      VVar17 = (*(code *)detail::vulkan_functions()::v._88_8_)
                         (&local_1a8,(this->info).allocation_callbacks);
      if (VVar17 == VK_SUCCESS) {
        detail::VulkanFunctions::init_instance_funcs
                  ((VulkanFunctions *)detail::vulkan_functions()::v,local_1e8);
        if (((this->info).use_debug_messenger == true) &&
           (VVar17 = create_debug_utils_messenger
                               (local_1e8,(this->info).debug_callback,
                                (this->info).debug_message_severity,(this->info).debug_message_type,
                                (this->info).debug_user_data_pointer,&pVStack_1e0,
                                (this->info).allocation_callbacks), VVar17 != VK_SUCCESS)) {
          (__return_storage_ptr__->field_0).m_error.type._M_value = 7;
          goto LAB_001040cf;
        }
        uVar9 = detail::vulkan_functions()::v._192_8_;
        uVar8 = detail::vulkan_functions()::v._48_8_;
        local_1b8 = (this->info).headless_context;
        uStack_1b7 = local_254;
        local_1d8 = (this->info).allocation_callbacks;
        local_1c0 = CONCAT44(local_24c,local_250);
        uStack_1d0 = detail::vulkan_functions()::v._48_8_;
        local_1c8 = detail::vulkan_functions()::v._192_8_;
        (__return_storage_ptr__->field_0).m_value.instance = local_1e8;
        (__return_storage_ptr__->field_0).m_value.debug_messenger = pVStack_1e0;
        *(ulong *)((long)&__return_storage_ptr__->field_0 + 0x30) =
             CONCAT62(uStack_1b6,CONCAT11(local_254,local_1b8));
        (__return_storage_ptr__->field_0).m_value.allocation_callbacks = local_1d8;
        (__return_storage_ptr__->field_0).m_value.fp_vkGetInstanceProcAddr =
             (PFN_vkGetInstanceProcAddr)uVar8;
        (__return_storage_ptr__->field_0).m_value.fp_vkGetDeviceProcAddr =
             (PFN_vkGetDeviceProcAddr)uVar9;
        (__return_storage_ptr__->field_0).m_value.instance_version = local_250;
        (__return_storage_ptr__->field_0).m_value.api_version = local_24c;
        bVar10 = true;
      }
      else {
        (__return_storage_ptr__->field_0).m_error.type._M_value = 6;
LAB_001040cf:
        (__return_storage_ptr__->field_0).m_value.debug_messenger =
             (VkDebugUtilsMessengerEXT)&detail::instance_error_category;
        (__return_storage_ptr__->field_0).m_error.vk_result = VVar17;
        bVar10 = false;
      }
      __return_storage_ptr__->m_init = bVar10;
      std::_Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>::~_Vector_base
                (&local_248);
    }
    std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base(&local_228);
    std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base(&local_208);
  }
  else {
    if (detail::vulkan_functions()::v._80_8_ == 0) {
LAB_00103b2b:
      switch(uVar16 >> 0xc & 0x3ff) {
      case 0:
        goto switchD_00103b46_caseD_0;
      default:
        (__return_storage_ptr__->field_0).m_error.type._M_value = 2;
        break;
      case 2:
        (__return_storage_ptr__->field_0).m_error.type._M_value = 3;
        break;
      case 3:
        (__return_storage_ptr__->field_0).m_error.type._M_value = 4;
        break;
      case 4:
        (__return_storage_ptr__->field_0).m_error.type._M_value = 5;
      }
    }
    else {
      iVar15 = (*(code *)detail::vulkan_functions()::v._80_8_)(&local_250);
      uVar16 = (this->info).required_api_version;
      if (uVar16 == 0 || iVar15 == 0) {
        uVar1 = (this->info).minimum_instance_version;
        if ((uVar1 <= local_250) && (uVar16 <= local_250 || uVar1 != 0)) {
          uVar1 = uVar16;
          if (local_250 < 0x401000) {
            uVar1 = local_250;
          }
          goto LAB_00103bb1;
        }
        goto LAB_00103b2b;
      }
switchD_00103b46_caseD_0:
      (__return_storage_ptr__->field_0).m_error.type._M_value = 1;
    }
    (__return_storage_ptr__->field_0).m_value.debug_messenger =
         (VkDebugUtilsMessengerEXT)&detail::instance_error_category;
    (__return_storage_ptr__->field_0).m_error.vk_result = VK_SUCCESS;
    __return_storage_ptr__->m_init = false;
  }
  SystemInfo::~SystemInfo(&local_130);
LAB_00103ef1:
  Result<vkb::SystemInfo>::destroy(&local_70);
  return __return_storage_ptr__;
}

Assistant:

Result<Instance> InstanceBuilder::build() const {

    auto sys_info_ret = SystemInfo::get_system_info(info.fp_vkGetInstanceProcAddr);
    if (!sys_info_ret) return sys_info_ret.error();
    auto system = sys_info_ret.value();

    uint32_t instance_version = VKB_VK_API_VERSION_1_0;

    if (info.minimum_instance_version > VKB_VK_API_VERSION_1_0 || info.required_api_version > VKB_VK_API_VERSION_1_0) {
        PFN_vkEnumerateInstanceVersion pfn_vkEnumerateInstanceVersion = detail::vulkan_functions().fp_vkEnumerateInstanceVersion;

        if (pfn_vkEnumerateInstanceVersion != nullptr) {
            VkResult res = pfn_vkEnumerateInstanceVersion(&instance_version);
            // Should always return VK_SUCCESS
            if (res != VK_SUCCESS && info.required_api_version > 0)
                return make_error_code(InstanceError::vulkan_version_unavailable);
        }
        if (pfn_vkEnumerateInstanceVersion == nullptr || instance_version < info.minimum_instance_version ||
            (info.minimum_instance_version == 0 && instance_version < info.required_api_version)) {
            if (VK_VERSION_MINOR(info.required_api_version) == 4)
                return make_error_code(InstanceError::vulkan_version_1_4_unavailable);
            else if (VK_VERSION_MINOR(info.required_api_version) == 3)
                return make_error_code(InstanceError::vulkan_version_1_3_unavailable);
            else if (VK_VERSION_MINOR(info.required_api_version) == 2)
                return make_error_code(InstanceError::vulkan_version_1_2_unavailable);
            else if (VK_VERSION_MINOR(info.required_api_version))
                return make_error_code(InstanceError::vulkan_version_1_1_unavailable);
            else
                return make_error_code(InstanceError::vulkan_version_unavailable);
        }
    }

    uint32_t api_version = instance_version < VKB_VK_API_VERSION_1_1 ? instance_version : info.required_api_version;

    VkApplicationInfo app_info = {};
    app_info.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    app_info.pNext = nullptr;
    app_info.pApplicationName = info.app_name != nullptr ? info.app_name : "";
    app_info.applicationVersion = info.application_version;
    app_info.pEngineName = info.engine_name != nullptr ? info.engine_name : "";
    app_info.engineVersion = info.engine_version;
    app_info.apiVersion = api_version;

    std::vector<const char*> extensions;
    std::vector<const char*> layers;

    for (auto& ext : info.extensions)
        extensions.push_back(ext);
    if (info.debug_callback != nullptr && info.use_debug_messenger && system.debug_utils_available) {
        extensions.push_back(VK_EXT_DEBUG_UTILS_EXTENSION_NAME);
    }
    bool properties2_ext_enabled =
        api_version < VKB_VK_API_VERSION_1_1 && detail::check_extension_supported(system.available_extensions,
                                                    VK_KHR_GET_PHYSICAL_DEVICE_PROPERTIES_2_EXTENSION_NAME);
    if (properties2_ext_enabled) {
        extensions.push_back(VK_KHR_GET_PHYSICAL_DEVICE_PROPERTIES_2_EXTENSION_NAME);
    }

#if defined(VK_KHR_portability_enumeration)
    bool portability_enumeration_support =
        detail::check_extension_supported(system.available_extensions, VK_KHR_PORTABILITY_ENUMERATION_EXTENSION_NAME);
    if (portability_enumeration_support) {
        extensions.push_back(VK_KHR_PORTABILITY_ENUMERATION_EXTENSION_NAME);
    }
#else
    bool portability_enumeration_support = false;
#endif
    if (!info.headless_context) {
        auto check_add_window_ext = [&](const char* name) -> bool {
            if (!detail::check_extension_supported(system.available_extensions, name)) return false;
            extensions.push_back(name);
            return true;
        };
        bool khr_surface_added = check_add_window_ext("VK_KHR_surface");
#if defined(_WIN32)
        bool added_window_exts = check_add_window_ext("VK_KHR_win32_surface");
#elif defined(__ANDROID__)
        bool added_window_exts = check_add_window_ext("VK_KHR_android_surface");
#elif defined(_DIRECT2DISPLAY)
        bool added_window_exts = check_add_window_ext("VK_KHR_display");
#elif defined(__linux__) || defined(__FreeBSD__)
        // make sure all three calls to check_add_window_ext, don't allow short circuiting
        bool added_window_exts = check_add_window_ext("VK_KHR_xcb_surface");
        added_window_exts = check_add_window_ext("VK_KHR_xlib_surface") || added_window_exts;
        added_window_exts = check_add_window_ext("VK_KHR_wayland_surface") || added_window_exts;
#elif defined(__APPLE__)
        bool added_window_exts = check_add_window_ext("VK_EXT_metal_surface");
#endif
        if (!khr_surface_added || !added_window_exts)
            return make_error_code(InstanceError::windowing_extensions_not_present);
    }
    bool all_extensions_supported = detail::check_extensions_supported(system.available_extensions, extensions);
    if (!all_extensions_supported) {
        return make_error_code(InstanceError::requested_extensions_not_present);
    }

    for (auto& layer : info.layers)
        layers.push_back(layer);

    if (info.enable_validation_layers || (info.request_validation_layers && system.validation_layers_available)) {
        layers.push_back(detail::validation_layer_name);
    }
    bool all_layers_supported = detail::check_layers_supported(system.available_layers, layers);
    if (!all_layers_supported) {
        return make_error_code(InstanceError::requested_layers_not_present);
    }

    std::vector<VkBaseOutStructure*> pNext_chain;

    VkDebugUtilsMessengerCreateInfoEXT messengerCreateInfo = {};
    if (info.use_debug_messenger) {
        messengerCreateInfo.sType = VK_STRUCTURE_TYPE_DEBUG_UTILS_MESSENGER_CREATE_INFO_EXT;
        messengerCreateInfo.pNext = nullptr;
        messengerCreateInfo.messageSeverity = info.debug_message_severity;
        messengerCreateInfo.messageType = info.debug_message_type;
        messengerCreateInfo.pfnUserCallback = info.debug_callback;
        messengerCreateInfo.pUserData = info.debug_user_data_pointer;
        pNext_chain.push_back(reinterpret_cast<VkBaseOutStructure*>(&messengerCreateInfo));
    }

    VkValidationFeaturesEXT features{};
    if (info.enabled_validation_features.size() != 0 || info.disabled_validation_features.size()) {
        features.sType = VK_STRUCTURE_TYPE_VALIDATION_FEATURES_EXT;
        features.pNext = nullptr;
        features.enabledValidationFeatureCount = static_cast<uint32_t>(info.enabled_validation_features.size());
        features.pEnabledValidationFeatures = info.enabled_validation_features.data();
        features.disabledValidationFeatureCount = static_cast<uint32_t>(info.disabled_validation_features.size());
        features.pDisabledValidationFeatures = info.disabled_validation_features.data();
        pNext_chain.push_back(reinterpret_cast<VkBaseOutStructure*>(&features));
    }

    VkValidationFlagsEXT checks{};
    if (info.disabled_validation_checks.size() != 0) {
        checks.sType = VK_STRUCTURE_TYPE_VALIDATION_FLAGS_EXT;
        checks.pNext = nullptr;
        checks.disabledValidationCheckCount = static_cast<uint32_t>(info.disabled_validation_checks.size());
        checks.pDisabledValidationChecks = info.disabled_validation_checks.data();
        pNext_chain.push_back(reinterpret_cast<VkBaseOutStructure*>(&checks));
    }

    VkInstanceCreateInfo instance_create_info = {};
    instance_create_info.sType = VK_STRUCTURE_TYPE_INSTANCE_CREATE_INFO;
    detail::setup_pNext_chain(instance_create_info, pNext_chain);
#if !defined(NDEBUG)
    for (auto& node : pNext_chain) {
        assert(node->sType != VK_STRUCTURE_TYPE_APPLICATION_INFO);
    }
#endif
    instance_create_info.flags = info.flags;
    instance_create_info.pApplicationInfo = &app_info;
    instance_create_info.enabledExtensionCount = static_cast<uint32_t>(extensions.size());
    instance_create_info.ppEnabledExtensionNames = extensions.data();
    instance_create_info.enabledLayerCount = static_cast<uint32_t>(layers.size());
    instance_create_info.ppEnabledLayerNames = layers.data();
#if defined(VK_KHR_portability_enumeration)
    if (portability_enumeration_support) {
        instance_create_info.flags |= VK_INSTANCE_CREATE_ENUMERATE_PORTABILITY_BIT_KHR;
    }
#endif

    Instance instance;
    VkResult res =
        detail::vulkan_functions().fp_vkCreateInstance(&instance_create_info, info.allocation_callbacks, &instance.instance);
    if (res != VK_SUCCESS) return Result<Instance>(InstanceError::failed_create_instance, res);

    detail::vulkan_functions().init_instance_funcs(instance.instance);

    if (info.use_debug_messenger) {
        res = create_debug_utils_messenger(instance.instance,
            info.debug_callback,
            info.debug_message_severity,
            info.debug_message_type,
            info.debug_user_data_pointer,
            &instance.debug_messenger,
            info.allocation_callbacks);
        if (res != VK_SUCCESS) {
            return Result<Instance>(InstanceError::failed_create_debug_messenger, res);
        }
    }

    instance.headless = info.headless_context;
    instance.properties2_ext_enabled = properties2_ext_enabled;
    instance.allocation_callbacks = info.allocation_callbacks;
    instance.instance_version = instance_version;
    instance.api_version = api_version;
    instance.fp_vkGetInstanceProcAddr = detail::vulkan_functions().ptr_vkGetInstanceProcAddr;
    instance.fp_vkGetDeviceProcAddr = detail::vulkan_functions().fp_vkGetDeviceProcAddr;
    return instance;
}